

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Verify(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nTimeLim;
  char *pcVar3;
  uint fVerbose;
  char *pcVar4;
  uint fSeq;
  uint local_40;
  uint local_3c;
  
  nTimeLim = 0;
  Extra_UtilGetoptReset();
  local_40 = 1000;
  fSeq = 0;
  local_3c = 0;
  fVerbose = 0;
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"CTsdvh"), iVar1 = globalUtilOptind, iVar2 == 0x76)
      {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 < 0x54) break;
      if (iVar2 == 0x54) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_002816d4:
          Abc_Print(-1,pcVar3);
          goto LAB_002816e0;
        }
        nTimeLim = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar1 + 1;
        if ((int)nTimeLim < 0) goto LAB_002816e0;
      }
      else if (iVar2 == 100) {
        local_3c = local_3c ^ 1;
      }
      else {
        if (iVar2 != 0x73) goto LAB_002816e0;
        fSeq = fSeq ^ 1;
      }
    }
    if (iVar2 == -1) {
      if (globalUtilOptind + 1 == argc) {
        pcVar3 = argv[globalUtilOptind];
        Extra_FileNameCorrectPath(pcVar3);
        printf("Taking spec from file \"%s\".\n",pcVar3);
      }
      else {
        pcVar3 = (char *)0x0;
      }
      Gia_ManVerifyWithBoxes(pAbc->pGia,local_40,nTimeLim,fSeq,local_3c,fVerbose,pcVar3);
      return 0;
    }
    if (iVar2 != 0x43) break;
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
      goto LAB_002816d4;
    }
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
  } while (-1 < (int)local_40);
LAB_002816e0:
  Abc_Print(-2,"usage: &verify [-CT num] [-sdvh] <file>\n");
  Abc_Print(-2,"\t         performs verification of combinational design\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",(ulong)local_40);
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",(ulong)nTimeLim);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (fSeq == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle using sequential verification [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_3c == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle dumping AIGs to be compared [default = %s]\n",pcVar3);
  if (fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : optional file name with the spec [default = not used]\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Verify( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileSpec = NULL;
    int c, nBTLimit = 1000, nTimeLim = 0, fSeq = 0, fDumpFiles = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTsdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeLim < 0 )
                goto usage;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'd':
            fDumpFiles ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
    {
        pFileSpec = argv[globalUtilOptind];
        Extra_FileNameCorrectPath( pFileSpec );
        printf( "Taking spec from file \"%s\".\n", pFileSpec );
    }
    Gia_ManVerifyWithBoxes( pAbc->pGia, nBTLimit, nTimeLim, fSeq, fDumpFiles, fVerbose, pFileSpec );
    return 0;

usage:
    Abc_Print( -2, "usage: &verify [-CT num] [-sdvh] <file>\n" );
    Abc_Print( -2, "\t         performs verification of combinational design\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n",  nTimeLim );
    Abc_Print( -2, "\t-s     : toggle using sequential verification [default = %s]\n",  fSeq? "yes":"no");
    Abc_Print( -2, "\t-d     : toggle dumping AIGs to be compared [default = %s]\n",    fDumpFiles? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n",                 fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : optional file name with the spec [default = not used]\n" );
    return 1;
}